

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O0

void equation_system_add(aom_equation_system_t *dest,aom_equation_system_t *src)

{
  int iVar1;
  int iVar2;
  int j;
  int i;
  int n;
  aom_equation_system_t *src_local;
  aom_equation_system_t *dest_local;
  
  iVar1 = dest->n;
  for (i = 0; i < iVar1; i = i + 1) {
    for (j = 0; j < iVar1; j = j + 1) {
      iVar2 = i * iVar1 + j;
      dest->A[iVar2] = src->A[i * iVar1 + j] + dest->A[iVar2];
    }
    dest->b[i] = src->b[i] + dest->b[i];
  }
  return;
}

Assistant:

static void equation_system_add(aom_equation_system_t *dest,
                                aom_equation_system_t *src) {
  const int n = dest->n;
  int i, j;
  for (i = 0; i < n; ++i) {
    for (j = 0; j < n; ++j) {
      dest->A[i * n + j] += src->A[i * n + j];
    }
    dest->b[i] += src->b[i];
  }
}